

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O1

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<char[15],std::__cxx11::string>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,char (*v) [15],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ostringstream *unaff_R14;
  long lVar5;
  
  lVar5 = idx << 5;
  bVar2 = false;
  do {
    pbVar1 = (sv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(sv->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= idx) {
LAB_002819da:
      if (bVar2) {
        ss = unaff_R14;
      }
      return ss;
    }
    iVar3 = ::std::__cxx11::string::compare((char *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5));
    if (iVar3 == 0) {
      sVar4 = strlen(*v);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)ss,*v,sVar4);
      format_sv_rec<std::__cxx11::string>
                ((ostringstream *)ss,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)sv,idx + 1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      goto LAB_002819da;
    }
    pbVar1 = (sv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ss,*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar5),
               *(long *)((long)&pbVar1->_M_string_length + lVar5));
    idx = idx + 1;
    if (!bVar2) {
      unaff_R14 = ss;
    }
    lVar5 = lVar5 + 0x20;
    bVar2 = true;
  } while( true );
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v, Rest const &...args) {
  if (idx >= sv.size()) {
    return ss;
  }

  if (sv[idx] == "{}") {
    ss << v;
    format_sv_rec(ss, sv, idx + 1, args...);
  } else {
    ss << sv[idx];
    format_sv_rec(ss, sv, idx + 1, v, args...);
  }

  return ss;
}